

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O3

value_type * __thiscall
(anonymous_namespace)::
serialize_and_visit<(anonymous_namespace)::ToString,std::vector<int,std::allocator<int>>>
          (value_type *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<int,_std::allocator<int>_> *in)

{
  uint *puVar1;
  long lVar2;
  cx_string<2UL> cVar3;
  value_type *pvVar4;
  string_view full_tag;
  string_view tag_00;
  cx_string<2UL> tag;
  InputStream istream;
  OutputStream ostream;
  ToString visitor;
  stringstream stream;
  cx_string<1UL> local_348;
  cx_string<1UL> local_346;
  undefined2 local_344;
  char local_342;
  InputStream local_340;
  OutputStream local_338;
  stringstream local_330 [16];
  long local_320;
  uint auStack_308 [22];
  ios_base aiStack_2b0 [264];
  long local_1a8 [3];
  undefined4 auStack_18c [25];
  ios_base aiStack_128 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  lVar2 = *(long *)(local_1a8[0] + -0x18);
  *(undefined4 *)((long)auStack_18c + lVar2) = 4;
  std::ios::clear((int)&stack0xfffffffffffffca8 + (int)lVar2 + 0x1b0);
  local_338.stream = (stringstream *)local_1a8;
  mserialize::detail::BuiltinSerializer<std::vector<int,_std::allocator<int>_>,_void>::
  serialize<OutputStream>((vector<int,_std::allocator<int>_> *)this,&local_338);
  std::__cxx11::stringstream::stringstream(local_330);
  puVar1 = (uint *)((long)auStack_308 + *(long *)(local_320 + -0x18));
  *puVar1 = *puVar1 | 1;
  local_346._data[0] = '[';
  local_346._data[1] = '\0';
  local_348._data[0] = 'i';
  local_348._data[1] = '\0';
  local_340.stream = (stringstream *)local_1a8;
  cVar3 = mserialize::cx_strcat<1ul,1ul>(&local_346,&local_348);
  local_344 = cVar3._data._0_2_;
  local_342 = cVar3._data[2];
  full_tag._len = 2;
  full_tag._ptr = (char *)&local_344;
  tag_00._len = 2;
  tag_00._ptr = (char *)&local_344;
  mserialize::detail::visit_impl<(anonymous_namespace)::ToString,InputStream>
            (full_tag,tag_00,(ToString *)local_330,&local_340,0x800);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_330);
  std::ios_base::~ios_base(aiStack_2b0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  pvVar4 = (value_type *)std::ios_base::~ios_base(aiStack_128);
  return pvVar4;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}